

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O3

void __thiscall Assimp::Discreet3DSImporter::ParseLightChunk(Discreet3DSImporter *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  StreamReader<false,_false> *this_00;
  aiLight *paVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  Chunk chunk;
  Chunk local_26;
  
  if (5 < (uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current)) {
    do {
      ReadChunk(this,&local_26);
      if ((int)(local_26.Size - 6) < 1) {
        uVar6 = (int)this->stream->limit - (int)this->stream->current;
      }
      else {
        this_00 = this->stream;
        uVar6 = StreamReader<false,_false>::SetReadLimit
                          (this_00,(local_26.Size - 6) +
                                   (*(int *)&this_00->current - *(int *)&this_00->buffer));
        paVar5 = (this->mScene->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1];
        if (local_26.Flag < 0x4610) {
          if ((local_26.Flag == 0x10) || (local_26.Flag == 0x13)) {
            fVar7 = StreamReader<false,_false>::Get<float>(this->stream);
            (paVar5->mColorDiffuse).r = fVar7 * (paVar5->mColorDiffuse).r;
            fVar7 = StreamReader<false,_false>::Get<float>(this->stream);
            (paVar5->mColorDiffuse).g = fVar7 * (paVar5->mColorDiffuse).g;
            fVar7 = StreamReader<false,_false>::Get<float>(this->stream);
            (paVar5->mColorDiffuse).b = fVar7 * (paVar5->mColorDiffuse).b;
          }
        }
        else if (local_26.Flag == 0x465b) {
          fVar7 = StreamReader<false,_false>::Get<float>(this->stream);
          uVar2 = (paVar5->mColorDiffuse).r;
          uVar4 = (paVar5->mColorDiffuse).g;
          (paVar5->mColorDiffuse).r = fVar7 * (float)uVar2;
          (paVar5->mColorDiffuse).g = fVar7 * (float)uVar4;
          (paVar5->mColorDiffuse).b = (paVar5->mColorDiffuse).b * fVar7;
        }
        else if (local_26.Flag == 0x4625) {
          fVar7 = StreamReader<false,_false>::Get<float>(this->stream);
          paVar5->mAttenuationLinear = fVar7;
        }
        else if (local_26.Flag == 0x4610) {
          paVar5->mType = aiLightSource_SPOT;
          fVar7 = StreamReader<false,_false>::Get<float>(this->stream);
          (paVar5->mDirection).x = fVar7 - (paVar5->mPosition).x;
          fVar7 = StreamReader<false,_false>::Get<float>(this->stream);
          (paVar5->mDirection).y = fVar7 - (paVar5->mPosition).y;
          fVar7 = StreamReader<false,_false>::Get<float>(this->stream);
          fVar7 = fVar7 - (paVar5->mPosition).z;
          uVar1 = (paVar5->mDirection).x;
          uVar3 = (paVar5->mDirection).y;
          fVar8 = 1.0 / SQRT(fVar7 * fVar7 +
                             (float)uVar1 * (float)uVar1 + (float)uVar3 * (float)uVar3);
          (paVar5->mDirection).x = fVar8 * (float)uVar1;
          (paVar5->mDirection).y = fVar8 * (float)uVar3;
          (paVar5->mDirection).z = fVar7 * fVar8;
          fVar7 = StreamReader<false,_false>::Get<float>(this->stream);
          paVar5->mAngleInnerCone = fVar7 * 0.017453292;
          fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
          paVar5->mAngleOuterCone = fVar8 * 0.017453292 + fVar7 * 0.017453292;
        }
        this->stream->current = this->stream->limit;
        StreamReader<false,_false>::SetReadLimit(this->stream,uVar6);
        uVar6 = (int)this->stream->limit - (int)this->stream->current;
        if (uVar6 == 0) {
          return;
        }
      }
    } while (5 < uVar6);
  }
  return;
}

Assistant:

void Discreet3DSImporter::ParseLightChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();
    aiLight* light = mScene->mLights.back();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_DL_SPOTLIGHT:
        // Now we can be sure that the light is a spot light
        light->mType = aiLightSource_SPOT;

        // We wouldn't need to normalize here, but we do it
        light->mDirection.x = stream->GetF4() - light->mPosition.x;
        light->mDirection.y = stream->GetF4() - light->mPosition.y;
        light->mDirection.z = stream->GetF4() - light->mPosition.z;
        light->mDirection.Normalize();

        // Now the hotspot and falloff angles - in degrees
        light->mAngleInnerCone = AI_DEG_TO_RAD( stream->GetF4() );

        // FIX: the falloff angle is just an offset
        light->mAngleOuterCone = light->mAngleInnerCone+AI_DEG_TO_RAD( stream->GetF4() );
        break;

        // intensity multiplier
    case Discreet3DS::CHUNK_DL_MULTIPLIER:
        light->mColorDiffuse = light->mColorDiffuse * stream->GetF4();
        break;

        // light color
    case Discreet3DS::CHUNK_RGBF:
    case Discreet3DS::CHUNK_LINRGBF:
        light->mColorDiffuse.r *= stream->GetF4();
        light->mColorDiffuse.g *= stream->GetF4();
        light->mColorDiffuse.b *= stream->GetF4();
        break;

        // light attenuation
    case Discreet3DS::CHUNK_DL_ATTENUATE:
        light->mAttenuationLinear = stream->GetF4();
        break;
    };

    ASSIMP_3DS_END_CHUNK();
}